

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

void parse(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
          cio_read_buffer *read_buffer,size_t bytes_to_parse)

{
  ulong uVar1;
  size_t sVar2;
  
  if (err < CIO_SUCCESS) {
    handle_server_error((cio_http_client *)handler_context,"Reading from buffered stream failed!");
    return;
  }
  if (err == CIO_EOF) {
    bytes_to_parse = 0;
  }
  uVar1 = *(ulong *)((long)handler_context + 0x310);
  if (uVar1 != 0) {
    bytes_to_parse = (long)read_buffer->add_ptr - (long)read_buffer->fetch_ptr;
    if (uVar1 <= bytes_to_parse) {
      bytes_to_parse = uVar1;
    }
    *(ulong *)((long)handler_context + 0x310) = uVar1 - bytes_to_parse;
  }
  *(int *)((long)handler_context + 0x31c) = *(int *)((long)handler_context + 0x31c) + 1;
  sVar2 = http_parser_execute((http_parser *)((long)handler_context + 0x358),
                              (http_parser_settings *)((long)handler_context + 0x378),
                              (char *)read_buffer->fetch_ptr,bytes_to_parse);
  read_buffer->fetch_ptr = read_buffer->fetch_ptr + sVar2;
  *(int *)((long)handler_context + 0x31c) = *(int *)((long)handler_context + 0x31c) + -1;
  if (err != CIO_EOF) {
    if (sVar2 == bytes_to_parse) {
      if (*(char *)((long)handler_context + 0x31b) == '\x01') goto LAB_00103f1a;
      if (-1 < *(int *)((long)handler_context + 0x36c)) {
        (**(code **)((long)handler_context + 0x328))(handler_context);
        return;
      }
    }
    else {
      parse_cold_1();
    }
    return;
  }
LAB_00103f1a:
  cio_timer_close((cio_timer *)((long)handler_context + 0x290));
  cio_timer_close((cio_timer *)((long)handler_context + 0x2d0));
  notify_free_handler_and_close_stream((cio_http_client *)handler_context);
  return;
}

Assistant:

static void parse(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *read_buffer, size_t bytes_to_parse)
{
	(void)buffered_stream;

	struct cio_http_client *client = (struct cio_http_client *)handler_context;
	http_parser *parser = &client->parser;

	if (cio_unlikely(cio_is_error(err))) {
		handle_server_error(client, "Reading from buffered stream failed!");
		return;
	}

	if (err == CIO_EOF) {
		bytes_to_parse = 0;
	}

	if (client->http_private.remaining_content_length > 0) {
		size_t available = cio_read_buffer_unread_bytes(read_buffer);
		bytes_to_parse = CIO_MIN(available, client->http_private.remaining_content_length);
		client->http_private.remaining_content_length -= bytes_to_parse;
	}

	client->http_private.parsing++;

	size_t nparsed = http_parser_execute(parser, &client->parser_settings, (const char *)cio_read_buffer_get_read_ptr(read_buffer), bytes_to_parse);
	cio_read_buffer_consume(read_buffer, nparsed);
	client->http_private.parsing--;

	if (err == CIO_EOF) {
		close_client(client);
		return;
	}

	if (cio_unlikely(nparsed != bytes_to_parse)) {
		err = write_response(client, CIO_HTTP_STATUS_BAD_REQUEST, NULL, NULL);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			close_client(client);
		}

		return;
	}

	if (client->http_private.to_be_closed) {
		close_client(client);
		return;
	}

	if (parser->upgrade) {
		return;
	}

	client->http_private.finish_func(client);
}